

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

qint64 __thiscall
QNetworkReplyHttpImpl::readData(QNetworkReplyHttpImpl *this,char *data,qint64 maxlen)

{
  QDecompressHelper *this_00;
  QNetworkReplyHttpImplPrivate *this_01;
  QArrayData *pQVar1;
  bool bVar2;
  qint64 qVar3;
  size_t in_RCX;
  size_t __n;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QArrayData *local_88;
  int local_80;
  QChar local_78;
  QArrayData *local_70 [3];
  QArrayData *local_58;
  QArrayData **ppQStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QNetworkReplyHttpImplPrivate **)(this + 8);
  if (this_01->cacheLoadDevice != (QIODevice *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      qVar3 = QIODevice::read((char *)this_01->cacheLoadDevice,(longlong)data);
      return qVar3;
    }
    goto LAB_00217026;
  }
  if (this_01->downloadZerocopyBuffer == (char *)0x0) {
    this_00 = &this_01->decompressHelper;
    bVar2 = QDecompressHelper::isValid(this_00);
    if (bVar2) {
      bVar2 = QDecompressHelper::hasData(this_00);
      if (!bVar2) {
        bVar2 = QNetworkReply::isFinished((QNetworkReply *)this);
        if (bVar2) goto LAB_00216dd5;
      }
      if (maxlen != 0) {
        bVar2 = QDecompressHelper::hasData(this_00);
        if (bVar2) {
          __n = QDecompressHelper::read(this_00,(int)data,(void *)maxlen,in_RCX);
          bVar2 = QDecompressHelper::isValid(this_00);
          if (bVar2) {
            if (this_01->cacheSaveDevice != (QIODevice *)0x0) {
              QIODevice::write((char *)this_01->cacheSaveDevice,(longlong)data);
              bVar2 = QNetworkReply::isFinished((QNetworkReply *)this);
              if (bVar2) {
                bVar2 = QDecompressHelper::hasData(this_00);
                if (!bVar2) {
                  QNetworkReplyHttpImplPrivate::completeCacheSave(this_01);
                }
              }
            }
            pQVar1 = (QArrayData *)this_01->bytesBuffered;
            this_01->bytesBuffered = 0;
            qVar3 = QNetworkReply::readBufferSize((QNetworkReply *)this);
            if (qVar3 != 0) {
              ppQStack_50 = local_70;
              local_58 = (QArrayData *)0x0;
              local_70[0] = pQVar1;
              QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_58);
            }
          }
          else {
            QCoreApplication::translate((char *)local_70,"QHttp","Decompression failed: %1",0);
            QDecompressHelper::errorString(this_00);
            QVar4.m_size = (size_t)local_70;
            QVar4.field_0.m_data = &local_58;
            QString::arg_impl(QVar4,local_80,local_78);
            QNetworkReplyHttpImplPrivate::error(this_01,UnknownContentError,(QString *)&local_58);
            if (local_58 != (QArrayData *)0x0) {
              LOCK();
              (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_58,2,0x10);
              }
            }
            if (local_88 != (QArrayData *)0x0) {
              LOCK();
              (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_88,2,0x10);
              }
            }
            if (local_70[0] != (QArrayData *)0x0) {
              LOCK();
              (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_70[0],2,0x10);
              }
            }
            QDecompressHelper::clear(this_00);
            __n = 0xffffffffffffffff;
          }
          goto LAB_00216f18;
        }
      }
    }
    else {
LAB_00216dd5:
      __n = 0xffffffffffffffff;
      if (this_01->state - Finished < 2) goto LAB_00216f18;
      pQVar1 = (QArrayData *)this_01->bytesBuffered;
      this_01->bytesBuffered = 0;
      qVar3 = QNetworkReply::readBufferSize((QNetworkReply *)this);
      if (qVar3 != 0) {
        ppQStack_50 = local_70;
        local_58 = (QArrayData *)0x0;
        local_70[0] = pQVar1;
        QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_58);
      }
    }
    __n = 0;
  }
  else {
    __n = this_01->downloadBufferCurrentSize - this_01->downloadBufferReadPosition;
    if (maxlen <= (long)__n) {
      __n = maxlen;
    }
    memcpy(data,this_01->downloadZerocopyBuffer + this_01->downloadBufferReadPosition,__n);
    this_01->downloadBufferReadPosition = this_01->downloadBufferReadPosition + __n;
  }
LAB_00216f18:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __n;
  }
LAB_00217026:
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkReplyHttpImpl::readData(char* data, qint64 maxlen)
{
    Q_D(QNetworkReplyHttpImpl);

    // cacheload device
    if (d->cacheLoadDevice) {
        // FIXME bytesdownloaded, position etc?

        qint64 ret = d->cacheLoadDevice->read(data, maxlen);
        return ret;
    }

    // zerocopy buffer
    if (d->downloadZerocopyBuffer) {
        // FIXME bytesdownloaded, position etc?

        qint64 howMuch = qMin(maxlen, (d->downloadBufferCurrentSize - d->downloadBufferReadPosition));
        memcpy(data, d->downloadZerocopyBuffer + d->downloadBufferReadPosition, howMuch);
        d->downloadBufferReadPosition += howMuch;
        return howMuch;

    }

    if (d->decompressHelper.isValid() && (d->decompressHelper.hasData() || !isFinished())) {
        if (maxlen == 0 || !d->decompressHelper.hasData())
            return 0;
        const qint64 bytesRead = d->decompressHelper.read(data, maxlen);
        if (!d->decompressHelper.isValid()) {
            d->error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                     QCoreApplication::translate("QHttp", "Decompression failed: %1")
                             .arg(d->decompressHelper.errorString()));
            d->decompressHelper.clear();
            return -1;
        }
        if (d->cacheSaveDevice) {
            // Need to write to the cache now that we have the data
            d->cacheSaveDevice->write(data, bytesRead);
            // ... and if we've read everything then the cache can be closed.
            if (isFinished() && !d->decompressHelper.hasData())
                d->completeCacheSave();
        }
        // In case of buffer size restriction we need to emit that it has been emptied
        qint64 wasBuffered = d->bytesBuffered;
        d->bytesBuffered = 0;
        if (readBufferSize())
            emit readBufferFreed(wasBuffered);
        return bytesRead;
    }

    // normal buffer
    if (d->state == d->Finished || d->state == d->Aborted)
        return -1;

    qint64 wasBuffered = d->bytesBuffered;
    d->bytesBuffered = 0;
    if (readBufferSize())
        emit readBufferFreed(wasBuffered);
    return 0;
}